

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_dump_image_comp_header
               (opj_image_comp_t *comp_header,opj_bool dev_dump_flag,FILE *out_stream)

{
  FILE *in_RDX;
  int in_ESI;
  uint *in_RDI;
  char tab [3];
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  FILE *local_18;
  int local_c;
  uint *local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (in_ESI == 0) {
    local_1b = 9;
    local_1a = 9;
    local_19 = 0;
  }
  else {
    fprintf(_stdout,"[DEV] Dump an image_comp_header struct {\n");
    local_1b = 0;
  }
  fprintf(local_18,"%s dx=%d, dy=%d\n",&local_1b,(ulong)*local_8,(ulong)local_8[1]);
  fprintf(local_18,"%s prec=%d\n",&local_1b,(ulong)local_8[6]);
  fprintf(local_18,"%s sgnd=%d\n",&local_1b,(ulong)local_8[8]);
  if (local_c != 0) {
    fprintf(local_18,"}\n");
  }
  return;
}

Assistant:

void j2k_dump_image_comp_header(opj_image_comp_t* comp_header, opj_bool dev_dump_flag, FILE* out_stream)
{
	char tab[3];

	if (dev_dump_flag){
		fprintf(stdout, "[DEV] Dump an image_comp_header struct {\n");
		tab[0] = '\0';
	}	else {
		tab[0] = '\t';tab[1] = '\t';tab[2] = '\0';
	}

	fprintf(out_stream, "%s dx=%d, dy=%d\n", tab, comp_header->dx, comp_header->dy);
	fprintf(out_stream, "%s prec=%d\n", tab, comp_header->prec);
	fprintf(out_stream, "%s sgnd=%d\n", tab, comp_header->sgnd);

	if (dev_dump_flag)
		fprintf(out_stream, "}\n");
}